

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Cluster::CreateSimpleBlock(Cluster *this,longlong st,longlong sz)

{
  long *plVar1;
  void *size;
  long in_RDI;
  long status;
  SimpleBlock *p;
  BlockEntry **pEntry;
  BlockEntry **ppEntry;
  long idx;
  void *pvVar2;
  long in_stack_ffffffffffffffa0;
  Cluster *in_stack_ffffffffffffffa8;
  SimpleBlock *in_stack_ffffffffffffffb0;
  long local_8;
  
  plVar1 = (long *)(*(long *)(in_RDI + 0x30) + *(long *)(in_RDI + 0x40) * 8);
  size = operator_new(0x50,(nothrow_t *)&std::nothrow);
  pvVar2 = (void *)0x0;
  if (size != (void *)0x0) {
    SimpleBlock::SimpleBlock
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,0,
               (longlong)size);
    pvVar2 = size;
  }
  *plVar1 = (long)pvVar2;
  if (*plVar1 == 0) {
    local_8 = -1;
  }
  else {
    local_8 = SimpleBlock::Parse((SimpleBlock *)0x188dd1);
    if (local_8 == 0) {
      *(long *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x40) + 1;
      local_8 = 0;
    }
    else {
      if ((long *)*plVar1 != (long *)0x0) {
        (**(code **)(*(long *)*plVar1 + 8))();
      }
      *plVar1 = 0;
    }
  }
  return local_8;
}

Assistant:

long Cluster::CreateSimpleBlock(long long st, long long sz) {
  assert(m_entries);
  assert(m_entries_size > 0);
  assert(m_entries_count >= 0);
  assert(m_entries_count < m_entries_size);

  const long idx = m_entries_count;

  BlockEntry** const ppEntry = m_entries + idx;
  BlockEntry*& pEntry = *ppEntry;

  pEntry = new (std::nothrow) SimpleBlock(this, idx, st, sz);

  if (pEntry == NULL)
    return -1;  // generic error

  SimpleBlock* const p = static_cast<SimpleBlock*>(pEntry);

  const long status = p->Parse();

  if (status == 0) {
    ++m_entries_count;
    return 0;
  }

  delete pEntry;
  pEntry = 0;

  return status;
}